

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O0

void __thiscall CodegenC::FunctionTable::generate_tuple_functions(FunctionTable *this,Type *type)

{
  IndentPrinter *pIVar1;
  value_type pTVar2;
  ulong uVar3;
  bool bVar4;
  Type *pTVar5;
  size_type sVar6;
  const_reference ppTVar7;
  PrintNumber local_194;
  Type local_190;
  Format<CodegenC::Type,_PrintNumber> local_188;
  ulong local_168;
  size_t i_1;
  Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> local_138;
  PrintNumber local_110;
  PrintNumber local_10c;
  Format<PrintNumber,_PrintNumber> local_108;
  PrintNumber local_e4;
  Type local_e0;
  PrintNumber local_d4;
  Format<PrintNumber,_CodegenC::Type,_PrintNumber> local_d0;
  ulong local_a8;
  size_t i;
  Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> local_88;
  Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> local_60;
  IndentPrinter *local_38;
  IndentPrinter *printer;
  Type void_type;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *element_types;
  Type tuple_type;
  Type *type_local;
  FunctionTable *this_local;
  
  tuple_type.index = (size_t)type;
  element_types = (vector<const_Type_*,_std::allocator<const_Type_*>_> *)get_type(this,type);
  void_type.index = (size_t)TupleType::get_element_types(tuple_type.index);
  pTVar5 = TypeInterner::get_void_type();
  printer = (IndentPrinter *)get_type(this,pTVar5);
  local_38 = this->type_function_printer;
  pIVar1 = this->function_declaration_printer;
  format<CodegenC::Type,CodegenC::Type,CodegenC::Type>
            (&local_60,"static % %_copy(%);",(Type *)&element_types,(Type *)&element_types,
             (Type *)&element_types);
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>(pIVar1,&local_60);
  pIVar1 = local_38;
  format<CodegenC::Type,CodegenC::Type,CodegenC::Type>
            (&local_88,"static % %_copy(% tuple) {",(Type *)&element_types,(Type *)&element_types,
             (Type *)&element_types);
  IndentPrinter::println_increasing<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (pIVar1,&local_88);
  pIVar1 = local_38;
  format<CodegenC::Type>((Format<CodegenC::Type> *)&i,"% new_tuple;",(Type *)&element_types);
  IndentPrinter::println<Format<CodegenC::Type>>(pIVar1,(Format<CodegenC::Type> *)&i);
  for (local_a8 = 0; uVar3 = local_a8,
      sVar6 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::size
                        ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index),
      uVar3 < sVar6; local_a8 = local_a8 + 1) {
    ppTVar7 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                        ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index,
                         local_a8);
    bVar4 = is_managed(*ppTVar7);
    pIVar1 = local_38;
    if (bVar4) {
      local_d4 = print_number((uint)local_a8);
      ppTVar7 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                          ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index,
                           local_a8);
      local_e0 = get_type(this,*ppTVar7);
      local_e4 = print_number((uint)local_a8);
      format<PrintNumber,CodegenC::Type,PrintNumber>
                (&local_d0,"new_tuple.v% = %_copy(tuple.v%);",&local_d4,&local_e0,&local_e4);
      IndentPrinter::println<Format<PrintNumber,CodegenC::Type,PrintNumber>>(pIVar1,&local_d0);
    }
    else {
      ppTVar7 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                          ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index,
                           local_a8);
      pTVar2 = *ppTVar7;
      pTVar5 = TypeInterner::get_void_type();
      pIVar1 = local_38;
      if (pTVar2 != pTVar5) {
        local_10c = print_number((uint)local_a8);
        local_110 = print_number((uint)local_a8);
        format<PrintNumber,PrintNumber>(&local_108,"new_tuple.v% = tuple.v%;",&local_10c,&local_110)
        ;
        IndentPrinter::println<Format<PrintNumber,PrintNumber>>(pIVar1,&local_108);
      }
    }
  }
  IndentPrinter::println<char[18]>(local_38,(char (*) [18])"return new_tuple;");
  IndentPrinter::println_decreasing<char[2]>(local_38,(char (*) [2])0x1808d6);
  pIVar1 = this->function_declaration_printer;
  format<CodegenC::Type,CodegenC::Type,CodegenC::Type>
            (&local_138,"static % %_free(%);",(Type *)&printer,(Type *)&element_types,
             (Type *)&element_types);
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>(pIVar1,&local_138);
  pIVar1 = local_38;
  format<CodegenC::Type,CodegenC::Type,CodegenC::Type>
            ((Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)&i_1,
             "static % %_free(% tuple) {",(Type *)&printer,(Type *)&element_types,
             (Type *)&element_types);
  IndentPrinter::println_increasing<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (pIVar1,(Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)&i_1);
  for (local_168 = 0; uVar3 = local_168,
      sVar6 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::size
                        ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index),
      uVar3 < sVar6; local_168 = local_168 + 1) {
    ppTVar7 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                        ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index,
                         local_168);
    bVar4 = is_managed(*ppTVar7);
    pIVar1 = local_38;
    if (bVar4) {
      ppTVar7 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[]
                          ((vector<const_Type_*,_std::allocator<const_Type_*>_> *)void_type.index,
                           local_168);
      local_190 = get_type(this,*ppTVar7);
      local_194 = print_number((uint)local_168);
      format<CodegenC::Type,PrintNumber>(&local_188,"%_free(tuple.v%);",&local_190,&local_194);
      IndentPrinter::println<Format<CodegenC::Type,PrintNumber>>(pIVar1,&local_188);
    }
  }
  IndentPrinter::println_decreasing<char[2]>(local_38,(char (*) [2])0x1808d6);
  return;
}

Assistant:

void generate_tuple_functions(const ::Type* type) {
			const Type tuple_type = get_type(type);
			const std::vector<const ::Type*>& element_types = static_cast<const TupleType*>(type)->get_element_types();
			const Type void_type = get_type(TypeInterner::get_void_type());
			IndentPrinter& printer = type_function_printer;

			// tuple_copy
			function_declaration_printer.println(format("static % %_copy(%);", tuple_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_copy(% tuple) {", tuple_type, tuple_type, tuple_type));
			printer.println(format("% new_tuple;", tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("new_tuple.v% = %_copy(tuple.v%);", print_number(i), get_type(element_types[i]), print_number(i)));
				}
				else if (element_types[i] != TypeInterner::get_void_type()) {
					printer.println(format("new_tuple.v% = tuple.v%;", print_number(i), print_number(i)));
				}
			}
			printer.println("return new_tuple;");
			printer.println_decreasing("}");

			// tuple_free
			function_declaration_printer.println(format("static % %_free(%);", void_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_free(% tuple) {", void_type, tuple_type, tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("%_free(tuple.v%);", get_type(element_types[i]), print_number(i)));
				}
			}
			printer.println_decreasing("}");
		}